

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_expression.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::WindowExpression::Copy(WindowExpression *this)

{
  WindowBoundary WVar1;
  WindowExcludeMode WVar2;
  bool bVar3;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar4;
  OrderType *pOVar5;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var6;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var7;
  pointer pWVar8;
  pointer pPVar9;
  pointer *__ptr;
  long in_RSI;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar10
  ;
  OrderType *pOVar11;
  templated_unique_single_t new_window;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_48;
  unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true> local_40
  ;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> local_38
  ;
  
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)this;
  make_uniq<duckdb::WindowExpression,duckdb::ExpressionType_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((duckdb *)&local_40,(ExpressionType *)(in_RSI + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x38),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x58),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x78));
  pWVar8 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->(&local_40);
  (pWVar8->super_ParsedExpression).super_BaseExpression.type = *(ExpressionType *)(in_RSI + 8);
  (pWVar8->super_ParsedExpression).super_BaseExpression.expression_class =
       *(ExpressionClass *)(in_RSI + 9);
  ::std::__cxx11::string::_M_assign
            ((string *)&(pWVar8->super_ParsedExpression).super_BaseExpression.alias);
  (pWVar8->super_ParsedExpression).super_BaseExpression.query_location.index =
       *(idx_t *)(in_RSI + 0x30);
  puVar10 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              **)(in_RSI + 0x98);
  puVar4 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             **)(in_RSI + 0xa0);
  if (puVar10 != puVar4) {
    do {
      pWVar8 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
               ::operator->(&local_40);
      pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(puVar10);
      (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar9);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pWVar8->children,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_48);
      if (local_48._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar4);
  }
  puVar10 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              **)(in_RSI + 0xb0);
  puVar4 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             **)(in_RSI + 0xb8);
  if (puVar10 != puVar4) {
    do {
      pWVar8 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
               ::operator->(&local_40);
      pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(puVar10);
      (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar9);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pWVar8->partitions,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_48);
      if (local_48._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar4);
  }
  pOVar11 = *(OrderType **)(in_RSI + 200);
  pOVar5 = *(OrderType **)(in_RSI + 0xd0);
  if (pOVar11 != pOVar5) {
    do {
      pWVar8 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
               ::operator->(&local_40);
      pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)(pOVar11 + 8));
      (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar9);
      ::std::vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>>::
      emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>> *)&pWVar8->orders,
                 pOVar11,pOVar11 + 1,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_48);
      if (local_48._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      pOVar11 = pOVar11 + 0x10;
    } while (pOVar11 != pOVar5);
  }
  pOVar11 = *(OrderType **)(in_RSI + 0x110);
  pOVar5 = *(OrderType **)(in_RSI + 0x118);
  if (pOVar11 != pOVar5) {
    do {
      pWVar8 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
               ::operator->(&local_40);
      pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)(pOVar11 + 8));
      (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar9);
      ::std::vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>>::
      emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>> *)
                 &pWVar8->arg_orders,pOVar11,pOVar11 + 1,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_48);
      if (local_48._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      pOVar11 = pOVar11 + 0x10;
    } while (pOVar11 != pOVar5);
  }
  if (*(long *)(in_RSI + 0xe0) == 0) {
    local_48._M_head_impl = (ParsedExpression *)0x0;
  }
  else {
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)(in_RSI + 0xe0));
    (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar9);
  }
  pWVar8 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->(&local_40);
  _Var7._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (ParsedExpression *)0x0;
  _Var6._M_head_impl =
       (pWVar8->filter_expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pWVar8->filter_expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var6._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var6._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_48._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  WVar1 = *(WindowBoundary *)(in_RSI + 0xea);
  pWVar8 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->(&local_40);
  pWVar8->start = WVar1;
  WVar1 = *(WindowBoundary *)(in_RSI + 0xeb);
  pWVar8 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->(&local_40);
  pWVar8->end = WVar1;
  WVar2 = *(WindowExcludeMode *)(in_RSI + 0xec);
  pWVar8 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->(&local_40);
  pWVar8->exclude_clause = WVar2;
  if (*(long *)(in_RSI + 0xf0) == 0) {
    local_48._M_head_impl = (ParsedExpression *)0x0;
  }
  else {
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)(in_RSI + 0xf0));
    (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar9);
  }
  pWVar8 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->(&local_40);
  _Var7._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (ParsedExpression *)0x0;
  _Var6._M_head_impl =
       (pWVar8->start_expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pWVar8->start_expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var6._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var6._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_48._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (*(long *)(in_RSI + 0xf8) == 0) {
    local_48._M_head_impl = (ParsedExpression *)0x0;
  }
  else {
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)(in_RSI + 0xf8));
    (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar9);
  }
  pWVar8 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->(&local_40);
  _Var7._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (ParsedExpression *)0x0;
  _Var6._M_head_impl =
       (pWVar8->end_expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pWVar8->end_expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var6._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var6._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_48._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (*(long *)(in_RSI + 0x100) == 0) {
    local_48._M_head_impl = (ParsedExpression *)0x0;
  }
  else {
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)(in_RSI + 0x100));
    (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar9);
  }
  pWVar8 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->(&local_40);
  _Var7._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (ParsedExpression *)0x0;
  _Var6._M_head_impl =
       (pWVar8->offset_expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pWVar8->offset_expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var6._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var6._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_48._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (*(long *)(in_RSI + 0x108) == 0) {
    local_48._M_head_impl = (ParsedExpression *)0x0;
  }
  else {
    pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)(in_RSI + 0x108));
    (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_48,pPVar9);
  }
  pWVar8 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->(&local_40);
  _Var7._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (ParsedExpression *)0x0;
  _Var6._M_head_impl =
       (pWVar8->default_expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pWVar8->default_expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var7._M_head_impl;
  if (_Var6._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var6._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_48._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  bVar3 = *(bool *)(in_RSI + 0xe8);
  pWVar8 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->(&local_40);
  pWVar8->ignore_nulls = bVar3;
  bVar3 = *(bool *)(in_RSI + 0xe9);
  pWVar8 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
           ::operator->(&local_40);
  pWVar8->distinct = bVar3;
  *(unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_> *)
   local_38._M_t.
   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       local_40.
       super_unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowExpression_*,_std::default_delete<duckdb::WindowExpression>_>
       .super__Head_base<0UL,_duckdb::WindowExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )local_38._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> WindowExpression::Copy() const {
	auto new_window = make_uniq<WindowExpression>(type, catalog, schema, function_name);
	new_window->CopyProperties(*this);

	for (auto &child : children) {
		new_window->children.push_back(child->Copy());
	}

	for (auto &e : partitions) {
		new_window->partitions.push_back(e->Copy());
	}

	for (auto &o : orders) {
		new_window->orders.emplace_back(o.type, o.null_order, o.expression->Copy());
	}

	for (auto &o : arg_orders) {
		new_window->arg_orders.emplace_back(o.type, o.null_order, o.expression->Copy());
	}

	new_window->filter_expr = filter_expr ? filter_expr->Copy() : nullptr;

	new_window->start = start;
	new_window->end = end;
	new_window->exclude_clause = exclude_clause;
	new_window->start_expr = start_expr ? start_expr->Copy() : nullptr;
	new_window->end_expr = end_expr ? end_expr->Copy() : nullptr;
	new_window->offset_expr = offset_expr ? offset_expr->Copy() : nullptr;
	new_window->default_expr = default_expr ? default_expr->Copy() : nullptr;
	new_window->ignore_nulls = ignore_nulls;
	new_window->distinct = distinct;

	return std::move(new_window);
}